

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

Wln_Ntk_t * Wln_NtkDupDfs(Wln_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int iObj_00;
  Wln_Ntk_t *pNew_00;
  char *pcVar3;
  Wln_Ntk_t *pNew;
  int iFanin;
  int iObj;
  int k;
  int i;
  Wln_Ntk_t *p_local;
  
  pcVar3 = p->pName;
  iVar1 = Wln_NtkObjNum(p);
  pNew_00 = Wln_NtkAlloc(pcVar3,iVar1);
  pNew_00->fSmtLib = p->fSmtLib;
  if (p->pSpec != (char *)0x0) {
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    pNew_00->pSpec = pcVar3;
  }
  Wln_NtkCleanCopy(p);
  for (iObj = 0; iVar1 = Wln_NtkCiNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Wln_NtkCi(p,iObj);
    Wln_ObjDup(pNew_00,p,iVar1);
  }
  for (iObj = 0; iVar1 = Wln_NtkFfNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Wln_NtkFf(p,iObj);
    iVar2 = Wln_ObjClone(pNew_00,p,iVar1);
    Wln_ObjSetCopy(p,iVar1,iVar2);
  }
  for (iObj = 0; iVar1 = Wln_NtkCoNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Wln_NtkCo(p,iObj);
    Wln_NtkDupDfs_rec(pNew_00,p,iVar1);
  }
  for (iObj = 0; iVar1 = Wln_NtkFfNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Wln_NtkFf(p,iObj);
    for (iFanin = 0; iVar2 = Wln_ObjFaninNum(p,iVar1), iFanin < iVar2; iFanin = iFanin + 1) {
      iVar2 = Wln_ObjFanin(p,iVar1,iFanin);
      if (iVar2 != 0) {
        iObj_00 = Wln_ObjCopy(p,iVar1);
        iVar2 = Wln_NtkDupDfs_rec(pNew_00,p,iVar2);
        Wln_ObjAddFanin(pNew_00,iObj_00,iVar2);
      }
    }
  }
  iVar1 = Wln_NtkHasNameId(p);
  if (iVar1 != 0) {
    Wln_NtkTransferNames(pNew_00,p);
  }
  return pNew_00;
}

Assistant:

Wln_Ntk_t * Wln_NtkDupDfs( Wln_Ntk_t * p )
{
    int i, k, iObj, iFanin;
    Wln_Ntk_t * pNew = Wln_NtkAlloc( p->pName, Wln_NtkObjNum(p) );
    pNew->fSmtLib = p->fSmtLib;
    if ( p->pSpec ) pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Wln_NtkCleanCopy( p );
    Wln_NtkForEachCi( p, iObj, i )
        Wln_ObjDup( pNew, p, iObj );
    Wln_NtkForEachFf( p, iObj, i )
        Wln_ObjSetCopy( p, iObj, Wln_ObjClone(pNew, p, iObj) );
    Wln_NtkForEachCo( p, iObj, i )
        Wln_NtkDupDfs_rec( pNew, p, iObj );
    Wln_NtkForEachFf( p, iObj, i )
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Wln_ObjAddFanin( pNew, Wln_ObjCopy(p, iObj), Wln_NtkDupDfs_rec(pNew, p, iFanin) );
    if ( Wln_NtkHasNameId(p) )
        Wln_NtkTransferNames( pNew, p );
    return pNew;
}